

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_head_single.h
# Opt level: O0

bool __thiscall
density::detail::
LFQueue_Head<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)0,_density::detail::LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
::Consume::advance_head(Consume *this)

{
  ControlBlock *pCVar1;
  bool bVar2;
  bool bVar3;
  void *i_second;
  undefined8 *puVar4;
  ControlBlock *pCVar5;
  bool is_same_page;
  ExternalBlock *external_block;
  atomic<density::detail::LfQueueControl_*> next;
  Consume *this_local;
  
  i_second = (void *)(*(ulong *)(this + 0x10) & 0xfffffffffffffff0);
  if (*(long *)(*(long *)this + 0x80) == *(long *)(this + 8)) {
    *(void **)(*(long *)this + 0x80) = i_second;
    if ((*(ulong *)(this + 0x10) & 4) != 0) {
      puVar4 = (undefined8 *)address_add(*(void **)(this + 8),0x10);
      density_tests::DeepTestAllocator<256UL>::deallocate
                (*(DeepTestAllocator<256UL> **)this,(void *)*puVar4,puVar4[1],puVar4[2],0);
    }
    bVar2 = LFQueue_Base<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_density::detail::LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
            ::same_page(*(void **)(this + 8),i_second);
    bVar3 = address_is_aligned(i_second,0x100);
    if (bVar2 == bVar3) {
      density_tests::detail::assert_failed<>
                ("is_same_page != address_is_aligned(next, ALLOCATOR_TYPE::page_alignment)",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_head_single.h"
                 ,0x119);
    }
    bVar3 = ConstConditional(false);
    if ((bVar3) &&
       (pCVar1 = *(ControlBlock **)(this + 8),
       pCVar5 = LFQueue_Base<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_density::detail::LFQueue_Tail<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)1>_>
                ::get_end_control_block(*(void **)(this + 8)), bVar2 != (pCVar1 != pCVar5))) {
      density_tests::detail::assert_failed<>
                ("!ConstConditional(Base::s_needs_end_control) || is_same_page == (m_control != Base::get_end_control_block(m_control))"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_head_single.h"
                 ,0x11c);
    }
    if (!bVar2) {
      density_tests::DeepTestAllocator<256UL>::deallocate_page
                (*(DeepTestAllocator<256UL> **)this,*(void **)(this + 8));
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool advance_head()
                {
                    auto next = reinterpret_cast<ControlBlock *>(m_next_ptr & ~LfQueue_AllFlags);

                    if (m_queue->m_head == m_control)
                    {
                        m_queue->m_head = next;
                        if (m_next_ptr & LfQueue_External)
                        {
                            auto const external_block = static_cast<ExternalBlock *>(
                              address_add(m_control, Base::s_element_min_offset));
                            m_queue->ALLOCATOR_TYPE::deallocate(
                              external_block->m_block,
                              external_block->m_size,
                              external_block->m_alignment);
                        }

                        bool const is_same_page = Base::same_page(m_control, next);
                        DENSITY_ASSERT_INTERNAL(
                          is_same_page != address_is_aligned(next, ALLOCATOR_TYPE::page_alignment));
                        DENSITY_ASSERT_INTERNAL(
                          !ConstConditional(Base::s_needs_end_control) ||
                          is_same_page == (m_control != Base::get_end_control_block(m_control)));

                        static_assert(offsetof(ControlBlock, m_next) == 0, "");

                        if (Base::s_deallocate_zeroed_pages)
                        {
                            raw_atomic_store(&m_control->m_next, uintptr_t(0));
                        }

                        if (is_same_page)
                        {
                            if (Base::s_deallocate_zeroed_pages)
                            {
                                auto const memset_dest =
                                  const_cast<uintptr_t *>(&m_control->m_next) + 1;
                                auto const memset_size = address_diff(next, memset_dest);
                                DENSITY_ASSUME_ALIGNED(memset_dest, alignof(uintptr_t));
                                DENSITY_ASSUME_UINT_ALIGNED(memset_size, alignof(uintptr_t));
                                std::memset(memset_dest, 0, memset_size);
                            }
                        }
                        else
                        {
                            if (Base::s_deallocate_zeroed_pages)
                                m_queue->ALLOCATOR_TYPE::deallocate_page_zeroed(m_control);
                            else
                                m_queue->ALLOCATOR_TYPE::deallocate_page(m_control);
                        }
                        return true;
                    }
                    else
                    {
                        return false;
                    }
                }